

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

float trng::math::detail::GammaQ<float,false>(float a,float x)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = NAN;
  if ((0.0 < a) && (0.0 <= x)) {
    if (a + 1.0 <= x) {
      fVar3 = (x + 1.0) - a;
      fVar4 = 1.0 / fVar3;
      fVar5 = 0.0;
      fVar6 = 2.1267648e+37;
      fVar2 = fVar4;
      do {
        fVar5 = fVar5 + 1.0;
        fVar7 = (fVar5 - a) * -fVar5;
        fVar3 = fVar3 + 2.0;
        fVar2 = fVar2 * fVar7 + fVar3;
        fVar6 = fVar7 / fVar6 + fVar3;
        uVar1 = -(uint)(ABS(fVar6) < 4.7019774e-38);
        fVar6 = (float)(uVar1 & 0x1800000 | ~uVar1 & (uint)fVar6);
        uVar1 = -(uint)(ABS(fVar2) < 4.7019774e-38);
        fVar2 = (float)(uVar1 & 0x7d800000 | ~uVar1 & (uint)(1.0 / fVar2));
        fVar4 = fVar4 * fVar2 * fVar6;
        if (ABS(fVar2 * fVar6 + -1.0) <= 4.7683716e-07) break;
      } while (fVar5 < 24.0);
      fVar6 = logf(x);
      fVar6 = expf(fVar6 * a - x);
      return fVar6 * fVar4;
    }
    fVar6 = tgammaf(a);
    fVar2 = GammaP_ser<float,false>(a,x);
    fVar6 = fVar6 - fVar2;
  }
  return fVar6;
}

Assistant:

TRNG_CUDA_ENABLE T GammaQ(T a, T x) {
        if (x < 0 or a <= 0)
          return numeric_limits<T>::signaling_NaN();
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a) {
#else
        if (by_Gamma_a) {
#endif
          if (a > numeric_limits<T>::digits10 and x > T(3) / T(10) * a and
              x < T(235) / T(100) * a)
            return GammaQ_asympt(a, x);
          if (x < a + 1)
            return T{1} - GammaP_ser<T, true>(a, x);
          return GammaQ_cf<T, true>(a, x);
        } else {
          if (x < a + 1)
            return Gamma(a) - GammaP_ser<T, false>(a, x);
          return GammaQ_cf<T, false>(a, x);
        }
      }

    }